

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

error_code llvm::sys::fs::createUniqueFile(Twine *Model,SmallVectorImpl<char> *ResultPath,uint Mode)

{
  error_code eVar1;
  int FD;
  int local_14;
  
  eVar1 = createUniqueEntity(Model,&local_14,ResultPath,false,Mode,FS_File,F_None);
  if (eVar1._M_value == 0) {
    close(local_14);
  }
  eVar1._4_4_ = 0;
  return eVar1;
}

Assistant:

std::error_code createUniqueFile(const Twine &Model,
                                 SmallVectorImpl<char> &ResultPath,
                                 unsigned Mode) {
  int FD;
  auto EC = createUniqueFile(Model, FD, ResultPath, Mode);
  if (EC)
    return EC;
  // FD is only needed to avoid race conditions. Close it right away.
  close(FD);
  return EC;
}